

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFReader.cc
# Opt level: O2

int __thiscall
OpenMesh::IO::_OFFReader_::getColorType(_OFFReader_ *this,string *_line,bool _texCoordsAvailable)

{
  int iVar1;
  long lVar2;
  undefined7 in_register_00000011;
  int iVar3;
  size_type sVar4;
  string local_58 [8];
  string c1;
  
  sVar4 = _line->_M_string_length;
  if (sVar4 == 0) {
    return 0;
  }
  c1.field_2._12_4_ = (undefined4)CONCAT71(in_register_00000011,_texCoordsAvailable);
  while ((sVar4 != 0 && (iVar1 = isspace((int)*(_line->_M_dataplus)._M_p), iVar1 != 0))) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)_line);
    std::__cxx11::string::operator=((string *)_line,local_58);
    std::__cxx11::string::~string(local_58);
    sVar4 = _line->_M_string_length;
  }
  while ((sVar4 != 0 && (iVar1 = isspace((int)(_line->_M_dataplus)._M_p[sVar4 - 1]), iVar1 != 0))) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)_line);
    std::__cxx11::string::operator=((string *)_line,local_58);
    std::__cxx11::string::~string(local_58);
    sVar4 = _line->_M_string_length;
  }
  iVar1 = -2;
  while (lVar2 = std::__cxx11::string::find_first_of((char *)_line,0x1c7605), lVar2 != -1) {
    iVar1 = iVar1 + 1;
  }
  iVar3 = (iVar1 + 1) - (uint)(_line->_M_string_length == 0);
  iVar1 = iVar3 + 2;
  if (c1.field_2._M_local_buf[0xc] != '\0') {
    iVar1 = iVar3;
  }
  if (1 < iVar1 - 3U) {
    return iVar1;
  }
  std::__cxx11::string::find((char *)_line,0x1c7605);
  std::__cxx11::string::substr((ulong)local_58,(ulong)_line);
  lVar2 = std::__cxx11::string::find((char *)local_58,0x1c5d8a);
  iVar3 = (iVar1 != 3) + 5;
  if (lVar2 == -1) {
    iVar3 = iVar1;
  }
  std::__cxx11::string::~string(local_58);
  return iVar3;
}

Assistant:

int _OFFReader_::getColorType(std::string& _line, bool _texCoordsAvailable) const
{
/*
  0 : no Color
  1 : one int (e.g colormap index)
  2 : two items (error!)
  3 : 3 ints
  4 : 3 ints
  5 : 3 floats
  6 : 4 floats

*/
	// Check if we have any additional information here
	if ( _line.size() < 1 )
		return 0;

    //first remove spaces at start/end of the line
    while (_line.size() > 0 && std::isspace(_line[0]))
      _line = _line.substr(1);
    while (_line.size() > 0 && std::isspace(_line[ _line.length()-1 ]))
      _line = _line.substr(0, _line.length()-1);

    //count the remaining items in the line
    size_t found;
    int count = 0;

    found=_line.find_first_of(" ");
    while (found!=std::string::npos){
      count++;
      found=_line.find_first_of(" ",found+1);
    }

    if (!_line.empty()) count++;

    if (_texCoordsAvailable) count -= 2;

    if (count == 3 || count == 4){
      //get first item
      found = _line.find(" ");
      std::string c1 = _line.substr (0,found);

      if (c1.find(".") != std::string::npos){
        if (count == 3)
          count = 5;
        else
          count = 6;
      }
    }
  return count;
}